

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
SmallArray<InstructionRegVmFinalizeContext::FixupPoint,_32U>::grow
          (SmallArray<InstructionRegVmFinalizeContext::FixupPoint,_32U> *this,uint newSize)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  uint count;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  FixupPoint *pFVar6;
  long lVar7;
  uint i;
  uint uVar8;
  FixupPoint *pFVar9;
  ulong uVar10;
  
  uVar8 = (this->max >> 1) + this->max;
  count = newSize + 4;
  if (newSize < uVar8) {
    count = uVar8;
  }
  if (this->allocator == (Allocator *)0x0) {
    pFVar6 = (FixupPoint *)(*(code *)NULLC::alloc)(count << 4 | 4);
    if (count != 0) {
      pFVar9 = pFVar6;
      do {
        pFVar9->cmdIndex = 0;
        pFVar9->target = (VmBlock *)0x0;
        pFVar9 = pFVar9 + 1;
      } while (pFVar9 != pFVar6 + (int)count);
    }
  }
  else {
    pFVar6 = Allocator::construct<InstructionRegVmFinalizeContext::FixupPoint>
                       (this->allocator,count);
  }
  lVar7 = 0;
  uVar10 = 0;
  while( true ) {
    pFVar9 = this->data;
    if (this->count <= uVar10) break;
    puVar1 = (undefined4 *)((long)&pFVar9->cmdIndex + lVar7);
    uVar3 = puVar1[1];
    uVar4 = puVar1[2];
    uVar5 = puVar1[3];
    puVar2 = (undefined4 *)((long)&pFVar6->cmdIndex + lVar7);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
    puVar2[2] = uVar4;
    puVar2[3] = uVar5;
    uVar10 = uVar10 + 1;
    lVar7 = lVar7 + 0x10;
  }
  if (pFVar9 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pFVar9 != (FixupPoint *)0x0) {
        (*(code *)NULLC::dealloc)(pFVar9);
      }
    }
    else if (pFVar9 != (FixupPoint *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = pFVar6;
  this->max = count;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}